

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_long,_unsigned_short>::Run
          (DataTransform<unsigned_long,_unsigned_short> *this,istream *input_stream)

{
  ushort uVar1;
  int iVar2;
  NumericType NVar3;
  WarningType WVar4;
  bool bVar5;
  char *__nptr;
  bool bVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  size_t sVar10;
  ushort data_to_write;
  int iVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar14;
  undefined1 auVar15 [16];
  unsigned_long input_data;
  string word;
  char buffer [128];
  ulong local_270;
  string local_268;
  string *local_248;
  ulong local_240;
  ulong local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_248 = &this->print_format_;
  iVar11 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
      }
      else {
        piVar7 = __errno_location();
        iVar2 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_268);
        if (local_268._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_0013a610:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar2;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_0013a610;
        }
        lVar12 = (longdouble)9.223372e+18;
        lVar13 = (longdouble)0;
        if (lVar12 <= in_ST0) {
          lVar13 = lVar12;
        }
        local_238 = (ulong)ROUND(in_ST0 - lVar13);
        local_270 = (ulong)(lVar12 <= in_ST0) << 0x3f ^ local_238;
        bVar5 = false;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar6) goto LAB_0013a30e;
      if (bVar5) {
        if (bVar5) {
LAB_0013a5bb:
          bVar6 = true;
          if ((this->is_ascii_output_ == true) && (iVar11 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_0013a5fa:
          bVar6 = false;
        }
        return bVar6;
      }
    }
    else {
      bVar6 = sptk::ReadStream<unsigned_long>(&local_270,input_stream);
      if (!bVar6) goto LAB_0013a5bb;
LAB_0013a30e:
      data_to_write = this->minimum_value_;
      uVar1 = this->maximum_value_;
      if (data_to_write < uVar1) {
        NVar3 = this->input_numeric_type_;
        if (NVar3 == kFloatingPoint) {
          local_240 = local_270;
          if (((float)data_to_write <=
               (float)(long)local_270 + *(float *)(&DAT_00151b30 + (ulong)((long)local_270 < 0) * 4)
              ) && (data_to_write = uVar1,
                   (float)(long)local_270 +
                   *(float *)(&DAT_00151b30 + (ulong)((long)local_270 < 0) * 4) <= (float)uVar1))
          goto LAB_0013a3b1;
        }
        else if (NVar3 == kUnsignedInteger) {
          if (data_to_write <= local_270) {
LAB_0013a363:
            bVar6 = uVar1 < local_270;
            data_to_write = uVar1;
            if (local_270 <= uVar1) {
              data_to_write = (ushort)local_270;
            }
            goto LAB_0013a3b5;
          }
        }
        else {
          if (NVar3 != kSignedInteger) goto LAB_0013a3b1;
          if ((long)(ulong)data_to_write <= (long)local_270) goto LAB_0013a363;
        }
LAB_0013a401:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"x2x","");
          sptk::PrintErrorMessage(&local_268,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar4 == kExit) goto LAB_0013a5fa;
        }
      }
      else {
LAB_0013a3b1:
        bVar6 = false;
        data_to_write = (ushort)local_270;
LAB_0013a3b5:
        if ((bVar6) || (this->rounding_ == false)) {
          if (bVar6) goto LAB_0013a401;
        }
        else {
          auVar15._8_4_ = (int)(local_270 >> 0x20);
          auVar15._0_8_ = local_270;
          auVar15._12_4_ = 0x45300000;
          dVar14 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_270) - 4503599627370496.0);
          if (local_270 == 0) {
            dVar14 = dVar14 + -0.5;
          }
          else {
            dVar14 = dVar14 + 0.5;
          }
          data_to_write = (ushort)(int)dVar14;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar6 = sptk::SnPrintf<unsigned_short>(data_to_write,local_248,0x80,local_b8);
        if (!bVar6) goto LAB_0013a5fa;
        sVar10 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar10);
        if ((iVar11 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        bVar6 = sptk::WriteStream<unsigned_short>(data_to_write,(ostream *)&std::cout);
        if (!bVar6) goto LAB_0013a5fa;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }